

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

time_t cs_impl::runtime_cs_ext::time(time_t *__timer)

{
  time_t tVar1;
  
  tVar1 = cov::timer::time((time_t *)0x2);
  *(undefined1 *)(__timer + 2) = 1;
  *__timer = tVar1;
  return (time_t)__timer;
}

Assistant:

numeric time()
		{
			return cov::timer::time(cov::timer::time_unit::milli_sec);
		}